

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall
Js::FunctionBody::GetStatementIndexAndLengthAt
          (FunctionBody *this,int byteCodeOffset,UINT32 *statementIndex,UINT32 *statementLength)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  StatementMap *this_00;
  Utf8SourceInfo **ppUVar6;
  Utf8SourceInfo *this_01;
  SRCINFO *pSVar7;
  int local_54;
  ULONG offsetFromDocumentBegin;
  SRCINFO *srcInfo;
  StatementMap *statement;
  UINT32 *statementLength_local;
  UINT32 *statementIndex_local;
  int byteCodeOffset_local;
  FunctionBody *this_local;
  
  if (statementIndex == (UINT32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcd8,"(statementIndex != nullptr)","statementIndex != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (statementLength == (UINT32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcd9,"(statementLength != nullptr)","statementLength != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = FunctionProxy::IsInDebugMode((FunctionProxy *)this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcdb,"(this->IsInDebugMode())","this->IsInDebugMode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = GetEnclosingStatementMapFromByteCode(this,byteCodeOffset,false);
  if (this_00 == (StatementMap *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcde,"(statement != nullptr)","statement != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (this_00 == (StatementMap *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ppUVar6 = Memory::WriteBarrierPtr::operator_cast_to_Utf8SourceInfo__
                        ((WriteBarrierPtr *)
                         &(this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo);
    if (*ppUVar6 == (Utf8SourceInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xce7,"(m_utf8SourceInfo)","m_utf8SourceInfo");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_01 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this);
    pSVar7 = Utf8SourceInfo::GetSrcInfo(this_01);
    if (pSVar7 == (SRCINFO *)0x0) {
      local_54 = 0;
    }
    else {
      local_54 = pSVar7->ulCharOffset - pSVar7->ichMinHost;
    }
    iVar3 = regex::Interval::Begin(&this_00->sourceSpan);
    *statementIndex = iVar3 + local_54;
    iVar3 = regex::Interval::End(&this_00->sourceSpan);
    iVar4 = regex::Interval::Begin(&this_00->sourceSpan);
    *statementLength = iVar3 - iVar4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionBody::GetStatementIndexAndLengthAt(int byteCodeOffset, UINT32* statementIndex, UINT32* statementLength)
    {
        Assert(statementIndex != nullptr);
        Assert(statementLength != nullptr);

        Assert(this->IsInDebugMode());

        StatementMap * statement = GetEnclosingStatementMapFromByteCode(byteCodeOffset, false);
        Assert(statement != nullptr);

        // Bailout if we are unable to find a statement.
        // We shouldn't be missing these when a debugger is attached but we don't want to AV on retail builds.
        if (statement == nullptr)
        {
            return false;
        }

        Assert(m_utf8SourceInfo);
        const SRCINFO * srcInfo = GetUtf8SourceInfo()->GetSrcInfo();

        // Offset from the beginning of the document minus any host-supplied source characters.
        // Host supplied characters are inserted (for example) around onload:
        //      onload="foo('somestring', 0)" -> function onload(event).{.foo('somestring', 0).}
        ULONG offsetFromDocumentBegin = srcInfo ? srcInfo->ulCharOffset - srcInfo->ichMinHost : 0;

        *statementIndex = statement->sourceSpan.Begin() + offsetFromDocumentBegin;
        *statementLength = statement->sourceSpan.End() - statement->sourceSpan.Begin();
        return true;
    }